

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *this)

{
  pointer *ppnVar1;
  int iVar2;
  pointer pnVar3;
  pointer pcVar4;
  ptrdiff_t _Num;
  ulong uVar5;
  float fVar6;
  
  this->lower_bound = -INFINITY;
  fVar6 = compute_upper_bound(this);
  this->upper_bound = fVar6;
  make_init_node_0(this);
  pnVar3 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar3[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      shared_subvector::remove(&this->subvector,(char *)(ulong)pnVar3[-1].variables);
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar3[-1].sumr;
    uVar5 = (ulong)(this->subvector).m_element_size;
    if (uVar5 != 0) {
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar4 + this->solution,pcVar4 + pnVar3[-1].variables,uVar5);
    }
  }
  make_init_node_1(this);
  pnVar3 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar3[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      shared_subvector::remove(&this->subvector,(char *)(ulong)pnVar3[-1].variables);
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar3[-1].sumr;
    uVar5 = (ulong)(this->subvector).m_element_size;
    if (uVar5 != 0) {
      pcVar4 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar4 + this->solution,pcVar4 + pnVar3[-1].variables,uVar5);
    }
  }
  while ((this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    make_next_inequality_node(this);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }